

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void __thiscall minibag::View::~View(View *this)

{
  pointer ppMVar1;
  pointer ppBVar2;
  BagQuery *pBVar3;
  _Manager_type p_Var4;
  vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *__range1;
  pointer ppMVar5;
  pointer ppBVar6;
  
  ppMVar1 = (this->ranges_).
            super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar5 = (this->ranges_).
                 super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar5 != ppMVar1;
      ppMVar5 = ppMVar5 + 1) {
    operator_delete(*ppMVar5,0x20);
  }
  ppBVar6 = (this->queries_).
            super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppBVar2 = (this->queries_).
            super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppBVar6 != ppBVar2) {
    do {
      pBVar3 = *ppBVar6;
      if ((pBVar3 != (BagQuery *)0x0) &&
         (p_Var4 = (pBVar3->query).query_.super__Function_base._M_manager,
         p_Var4 != (_Manager_type)0x0)) {
        (*p_Var4)((_Any_data *)&pBVar3->query,(_Any_data *)&pBVar3->query,__destroy_functor);
      }
      operator_delete(pBVar3,0x40);
      ppBVar6 = ppBVar6 + 1;
    } while (ppBVar6 != ppBVar2);
    ppBVar6 = (this->queries_).
              super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppBVar6 != (pointer)0x0) {
    operator_delete(ppBVar6,(long)(this->queries_).
                                  super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar6
                   );
  }
  ppMVar5 = (this->ranges_).
            super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppMVar5 != (pointer)0x0) {
    operator_delete(ppMVar5,(long)(this->ranges_).
                                  super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar5
                   );
    return;
  }
  return;
}

Assistant:

View::~View() {
    for (MessageRange* range : ranges_)
        delete range;
    for (BagQuery* query : queries_)
        delete query;
}